

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

void __thiscall edition_unittest::TestFieldOrderings::~TestFieldOrderings(TestFieldOrderings *this)

{
  InternalMetadata *this_00;
  TestFieldOrderings_NestedMessage *this_01;
  ulong uVar1;
  LogMessageFatal local_20;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
  }
  uVar1 = this_00->ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy(&(this->field_0)._impl_.my_string_);
    this_01 = (this->field_0)._impl_.optional_nested_message_;
    if (this_01 != (TestFieldOrderings_NestedMessage *)0x0) {
      TestFieldOrderings_NestedMessage::~TestFieldOrderings_NestedMessage(this_01);
      operator_delete(this_01,0x28);
    }
    google::protobuf::internal::ExtensionSet::~ExtensionSet(&(this->field_0)._impl_._extensions_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/edition_unittest.pb.cc"
             ,0x6ba2,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

TestFieldOrderings::~TestFieldOrderings() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestFieldOrderings)
  SharedDtor(*this);
}